

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_decay_to_limit
               (tsdn_t *tsdn,arena_t *arena,arena_decay_t *decay,extents_t *extents,_Bool all,
               size_t npages_limit,size_t npages_decay_max,_Bool is_background_thread)

{
  extent_hooks_t *tsdn_00;
  size_t sVar1;
  malloc_mutex_t *in_RCX;
  tsdn_t *in_RDX;
  tsdn_t *in_RSI;
  extents_t *in_RDI;
  arena_t *unaff_retaddr;
  tsdn_t *in_stack_00000008;
  size_t npurged;
  size_t npurge;
  extent_list_t decay_extents;
  extent_hooks_t *extent_hooks;
  tsd_t *tsd;
  uint8_t state;
  tsdn_t *in_stack_ffffffffffffff38;
  tsdn_t *tsdn_01;
  extents_t *in_stack_ffffffffffffff60;
  extent_hooks_t **in_stack_ffffffffffffff68;
  extent_list_t in_stack_ffffffffffffff70;
  extent_heap_t *local_38;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  extents_t *in_stack_ffffffffffffffe8;
  extents_t *in_stack_fffffffffffffff0;
  extents_t *in_stack_fffffffffffffff8;
  
  if (in_RDI == (extents_t *)0x0) {
    local_38 = (extent_heap_t *)0x0;
  }
  else {
    in_stack_ffffffffffffffe7 = *(undefined1 *)&(in_RDI->mtx).field_0;
    local_38 = in_RDI[1].heaps + 0x8c;
    in_stack_ffffffffffffffe8 = in_RDI;
    in_stack_fffffffffffffff0 = in_RDI;
    in_stack_fffffffffffffff8 = in_RDI;
  }
  tsdn_01 = in_RDX;
  witness_assert_depth_to_rank((witness_tsdn_t *)local_38,0xc,1);
  malloc_mutex_assert_owner(in_stack_ffffffffffffff38,(malloc_mutex_t *)0x1205bb);
  if (((in_RDX->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx.cache[4].
       leafkey & 1) == 0) {
    *(undefined1 *)
     &(in_RDX->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx.cache[4].leafkey
         = 1;
    malloc_mutex_unlock(tsdn_01,in_RCX);
    tsdn_00 = extent_hooks_get((arena_t *)0x1205ed);
    extent_list_init((extent_list_t *)&stack0xffffffffffffff70);
    sVar1 = arena_stash_decayed((tsdn_t *)tsdn_00,(arena_t *)in_stack_ffffffffffffff70.qlh_first,
                                in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,(size_t)in_RSI,
                                (size_t)tsdn_01,(extent_list_t *)in_RDI);
    if (sVar1 != 0) {
      arena_decay_stashed(in_stack_00000008,unaff_retaddr,
                          (extent_hooks_t **)in_stack_fffffffffffffff8,
                          (arena_decay_t *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                          (_Bool)in_stack_ffffffffffffffe7,(extent_list_t *)tsd,
                          (_Bool)in_stack_ffffffffffffffe6);
    }
    malloc_mutex_lock(in_RSI,(malloc_mutex_t *)tsdn_01);
    *(undefined1 *)
     &(in_RDX->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx.cache[4].leafkey
         = 0;
  }
  return;
}

Assistant:

static void
arena_decay_to_limit(tsdn_t *tsdn, arena_t *arena, arena_decay_t *decay,
    extents_t *extents, bool all, size_t npages_limit, size_t npages_decay_max,
    bool is_background_thread) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 1);
	malloc_mutex_assert_owner(tsdn, &decay->mtx);

	if (decay->purging) {
		return;
	}
	decay->purging = true;
	malloc_mutex_unlock(tsdn, &decay->mtx);

	extent_hooks_t *extent_hooks = extent_hooks_get(arena);

	extent_list_t decay_extents;
	extent_list_init(&decay_extents);

	size_t npurge = arena_stash_decayed(tsdn, arena, &extent_hooks, extents,
	    npages_limit, npages_decay_max, &decay_extents);
	if (npurge != 0) {
		size_t npurged = arena_decay_stashed(tsdn, arena,
		    &extent_hooks, decay, extents, all, &decay_extents,
		    is_background_thread);
		assert(npurged == npurge);
	}

	malloc_mutex_lock(tsdn, &decay->mtx);
	decay->purging = false;
}